

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void updateAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  int *piVar1;
  int target;
  CollSeq *zP4;
  int iVar2;
  int iVar3;
  AggInfo_func *pAVar4;
  int iVar5;
  int p1;
  ExprList_item *pEVar6;
  Expr **ppEVar7;
  uint local_40;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  pAVar4 = pAggInfo->aFunc;
  p1 = 0;
  for (iVar2 = 0; iVar2 < pAggInfo->nFunc; iVar2 = iVar2 + 1) {
    pList = (pAVar4->pExpr->x).pList;
    local_40 = 0;
    iVar3 = 0;
    target = 0;
    if (pList != (ExprList *)0x0) {
      iVar3 = pList->nExpr;
      target = sqlite3GetTempRange(pParse,iVar3);
      sqlite3ExprCodeExprList(pParse,pList,target,0,'\x01');
    }
    if (-1 < pAVar4->iDistinct) {
      local_40 = sqlite3VdbeMakeLabel(p);
      codeDistinct(pParse,pAVar4->iDistinct,local_40,1,target);
    }
    if ((pAVar4->pFunc->funcFlags & 0x20) != 0) {
      pEVar6 = pList->a;
      zP4 = (CollSeq *)0x0;
      for (iVar5 = 0; (zP4 == (CollSeq *)0x0 && (iVar5 < iVar3)); iVar5 = iVar5 + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEVar6->pExpr);
        pEVar6 = pEVar6 + 1;
      }
      if (zP4 == (CollSeq *)0x0) {
        zP4 = pParse->db->pDfltColl;
      }
      if (p1 == 0) {
        if (pAggInfo->nAccumulator == 0) {
          p1 = 0;
        }
        else {
          p1 = pParse->nMem + 1;
          pParse->nMem = p1;
        }
      }
      sqlite3VdbeAddOp4(p,0x44,p1,0,0,(char *)zP4,-2);
    }
    sqlite3VdbeAddOp3(p,0x94,0,target,pAVar4->iMem);
    sqlite3VdbeAppendP4(p,pAVar4->pFunc,-8);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)iVar3 & 0xff;
    }
    sqlite3ExprCacheRemove(pParse,target,iVar3);
    sqlite3ReleaseTempRange(pParse,target,iVar3);
    if (local_40 != 0) {
      piVar1 = p->pParse->aLabel;
      if (piVar1 != (int *)0x0) {
        piVar1[(int)~local_40] = p->nOp;
      }
      sqlite3ExprCacheClear(pParse);
    }
    pAVar4 = pAVar4 + 1;
  }
  iVar3 = 0;
  iVar2 = 0;
  if (p1 != 0) {
    iVar2 = sqlite3VdbeAddOp1(p,0x15,p1);
  }
  sqlite3ExprCacheClear(pParse);
  ppEVar7 = &pAggInfo->aCol->pExpr;
  for (; iVar3 < pAggInfo->nAccumulator; iVar3 = iVar3 + 1) {
    sqlite3ExprCode(pParse,*ppEVar7,*(int *)((long)ppEVar7 + -4));
    ppEVar7 = ppEVar7 + 4;
  }
  pAggInfo->directMode = '\0';
  sqlite3ExprCacheClear(pParse);
  if (iVar2 == 0) {
    return;
  }
  sqlite3VdbeJumpHere(p,iVar2);
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(v);
      testcase( nArg==0 );  /* Error condition */
      testcase( nArg>1 );   /* Also an error */
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep0, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ExprCacheAffinityChange(pParse, regAgg, nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
      sqlite3ExprCacheClear(pParse);
    }
  }

  /* Before populating the accumulator registers, clear the column cache.
  ** Otherwise, if any of the required column values are already present 
  ** in registers, sqlite3ExprCode() may use OP_SCopy to copy the value
  ** to pC->iMem. But by the time the value is used, the original register
  ** may have been used, invalidating the underlying buffer holding the
  ** text or blob value. See ticket [883034dcb5].
  **
  ** Another solution would be to change the OP_SCopy used to copy cached
  ** values to an OP_Copy.
  */
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  sqlite3ExprCacheClear(pParse);
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  sqlite3ExprCacheClear(pParse);
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}